

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NonMaximumSuppression::clear_ClassLabels(NonMaximumSuppression *this)

{
  if (((this->_oneof_case_[1] == 0x65) || (this->_oneof_case_[1] == 100)) &&
     ((this->ClassLabels_).stringclasslabels_ != (StringVector *)0x0)) {
    (*(((this->ClassLabels_).stringclasslabels_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void NonMaximumSuppression::clear_ClassLabels() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NonMaximumSuppression)
  switch (ClassLabels_case()) {
    case kStringClassLabels: {
      delete ClassLabels_.stringclasslabels_;
      break;
    }
    case kInt64ClassLabels: {
      delete ClassLabels_.int64classlabels_;
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = CLASSLABELS_NOT_SET;
}